

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O3

FunctionBody * __thiscall
TTD::TTDebuggerSourceLocation::LoadFunctionBodyIfPossible
          (TTDebuggerSourceLocation *this,ScriptContext *inCtx)

{
  ULONG UVar1;
  ULONG UVar2;
  FunctionBody *pFVar3;
  
  pFVar3 = ScriptContextTTD::FindRootBodyByTopLevelCtr(inCtx->TTDContextInfo,this->m_topLevelBodyId)
  ;
  if (pFVar3 == (FunctionBody *)0x0) {
    return (FunctionBody *)0x0;
  }
  UVar1 = this->m_functionLine;
  UVar2 = Js::ParseableFunctionInfo::GetLineNumber(&pFVar3->super_ParseableFunctionInfo);
  if ((UVar1 == UVar2) &&
     (UVar1 = this->m_functionColumn,
     UVar2 = Js::ParseableFunctionInfo::GetColumnNumber(&pFVar3->super_ParseableFunctionInfo),
     UVar1 == UVar2)) {
    return pFVar3;
  }
  pFVar3 = UpdatePostInflateFunctionBody_Helper(this,pFVar3);
  return pFVar3;
}

Assistant:

Js::FunctionBody* TTDebuggerSourceLocation::LoadFunctionBodyIfPossible(Js::ScriptContext* inCtx) const
    {
        Js::FunctionBody* rootBody = inCtx->TTDContextInfo->FindRootBodyByTopLevelCtr(this->m_topLevelBodyId);
        if(rootBody == nullptr)
        {
            return nullptr;
        }

        if(this->m_functionLine == rootBody->GetLineNumber() && this->m_functionColumn == rootBody->GetColumnNumber())
        {
            return rootBody;
        }
        else
        {
            return this->UpdatePostInflateFunctionBody_Helper(rootBody);
        }
    }